

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,uint8 *value,uint64 size)

{
  int32 iVar1;
  int iVar2;
  
  if (((size != 0 && (value != (uint8 *)0x0 && writer != (IMkvWriter *)0x0)) &&
      (iVar1 = WriteID(writer,type), iVar1 == 0)) && (iVar1 = WriteUInt(writer,size), iVar1 == 0)) {
    iVar2 = (**writer->_vptr_IMkvWriter)(writer,value,size & 0xffffffff);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, const uint8* value,
                      uint64 size) {
  if (!writer || !value || size < 1)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, size))
    return false;

  if (writer->Write(value, static_cast<uint32>(size)))
    return false;

  return true;
}